

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

char * get_battle_condition(CHAR_DATA *victim,int percent)

{
  bool bVar1;
  char *pcVar2;
  AFFECT_DATA *pAVar3;
  
  bVar1 = is_affected(victim,(int)gsn_bluff);
  if (bVar1) {
    pAVar3 = (AFFECT_DATA *)&victim->affected;
    do {
      pAVar3 = pAVar3->next;
      if (pAVar3 == (AFFECT_DATA *)0x0) break;
    } while (pAVar3->type != gsn_bluff);
    percent = percent * pAVar3->modifier * 3;
  }
  if (percent < 100) {
    if (percent < 0x5a) {
      if (percent < 0x4b) {
        if (percent < 0x32) {
          if (percent < 0x1e) {
            if (percent < 0xf) {
              pcVar2 = "is nearly dead.";
              if (-1 < percent) {
                pcVar2 = "is convulsing on the ground.";
              }
            }
            else {
              pcVar2 = "is writhing in pain.";
            }
          }
          else {
            pcVar2 = "is gushing blood.";
          }
        }
        else {
          pcVar2 = "is covered in bleeding wounds.";
        }
      }
      else {
        pcVar2 = "has some small wounds.";
      }
    }
    else {
      pcVar2 = "has a few scratches.";
    }
  }
  else {
    pcVar2 = "is in perfect condition.";
  }
  return pcVar2;
}

Assistant:

const char *get_battle_condition(CHAR_DATA *victim, int percent)
{
	AFFECT_DATA *b_af = nullptr;

	if (is_affected(victim, gsn_bluff))
	{
		AFFECT_DATA *b_af = nullptr;

		for (b_af = victim->affected; b_af != nullptr; b_af = b_af->next)
		{
			if (b_af->type == gsn_bluff)
				break;
		}

		percent *= (b_af->modifier * 3);
	}

	if (percent >= 100)
		return "is in perfect condition.";
	else if (percent >= 90)
		return "has a few scratches.";
	else if (percent >= 75)
		return "has some small wounds.";
	else if (percent >= 50)
		return "is covered in bleeding wounds.";
	else if (percent >= 30)
		return "is gushing blood.";
	else if (percent >= 15)
		return "is writhing in pain.";
	else if (percent >= 0)
		return "is convulsing on the ground.";
	else
		return "is nearly dead.";
}